

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void Parser::print(TreeNode *treeNode,int deep)

{
  bool bVar1;
  ostream *poVar2;
  reference piVar3;
  reference treeNode_00;
  const_iterator cStack_30;
  int t;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int i;
  int deep_local;
  TreeNode *treeNode_local;
  
  for (__range1._0_4_ = 1; (int)__range1 < deep; __range1._0_4_ = (int)__range1 + 1) {
    std::operator<<((ostream *)&std::cout,"  ");
  }
  std::operator<<((ostream *)&std::cout,(string *)&treeNode->name);
  bVar1 = std::operator!=(&treeNode->attr,"_");
  if ((bVar1) && (bVar1 = std::operator!=(&treeNode->attr," "), bVar1)) {
    poVar2 = std::operator<<((ostream *)&std::cout," :");
    std::operator<<(poVar2,(string *)&treeNode->attr);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,treeNode->lineNum);
  poVar2 = std::operator<<(poVar2,",");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,treeNode->opt);
  poVar2 = std::operator<<(poVar2,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(&treeNode->sons);
  cStack_30 = std::vector<int,_std::allocator<int>_>::end(&treeNode->sons);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0), bVar1) {
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end1);
    treeNode_00 = std::vector<TreeNode,_std::allocator<TreeNode>_>::operator[]
                            (&resultTree,(long)*piVar3);
    print(treeNode_00,deep + 1);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void print(const TreeNode &treeNode,int deep){
        for(int i = 1;i < deep;i++){
            cout<<"  ";
        }
        cout<<treeNode.name;
        if(treeNode.attr!="_"&&treeNode.attr!=" "){
            cout<<" :"<<treeNode.attr;
        }
        cout<<"("<<treeNode.lineNum<<","<<treeNode.opt<<")"<<endl;
        for(int t:treeNode.sons){
            print(resultTree[t],deep+1);
        }
    }